

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

char * Gia_DeriveFormula(Gia_Man_t *pGia,char **ppNamesIn)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  size_t sVar4;
  int iVar5;
  Vec_Str_t *vStr;
  char *pcVar6;
  Gia_Man_t *p;
  
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  pcVar6 = (char *)malloc(1000);
  vStr->pArray = pcVar6;
  p = Gia_ManDupMuxes(pGia,2);
  if (pGia->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = *pGia->vCos->pArray;
  if ((-1 < (long)iVar1) && (iVar1 < pGia->nObjs)) {
    pGVar3 = pGia->pObjs;
    vStr->nSize = 1;
    *pcVar6 = '(';
    iVar5 = iVar1 - (*(uint *)(pGVar3 + iVar1) & 0x1fffffff);
    if (-1 < iVar5) {
      Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,(*(uint *)(pGVar3 + iVar1) >> 0x1d & 1) + iVar5 * 2)
      ;
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar1 = vStr->nSize;
      vStr->nSize = iVar1 + 1;
      pcVar6[iVar1] = ')';
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar1 = vStr->nSize;
      vStr->nSize = iVar1 + 1;
      pcVar6[iVar1] = '\0';
      Gia_ManStop(p);
      pcVar6 = vStr->pArray;
      free(vStr);
      return pcVar6;
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

char * Gia_DeriveFormula( Gia_Man_t * pGia, char ** ppNamesIn )
{
    char * pResult;
    Vec_Str_t * vStr   = Vec_StrAlloc( 1000 );
    Gia_Man_t * pMuxes = Gia_ManDupMuxes( pGia, 2 );
    Gia_Obj_t * pObj   = Gia_ManCo( pGia, 0 );
    Vec_StrPush( vStr, '(' );
    Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Gia_ObjFaninLit0p(pGia, pObj) );
    Vec_StrPush( vStr, ')' );
    Vec_StrPush( vStr, '\0' );
    Gia_ManStop( pMuxes );
    pResult = Vec_StrReleaseArray( vStr );
    Vec_StrFree( vStr );
    return pResult;
}